

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evenOdd.cpp
# Opt level: O1

int calculateEvenOddDifference(int *array,int size)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  int iVar4;
  uint uVar5;
  
  if (0 < size) {
    uVar3 = 0;
    iVar4 = 0;
    iVar2 = 0;
    do {
      uVar1 = array[uVar3];
      uVar5 = 0;
      if ((uVar1 & 1) == 0) {
        uVar5 = uVar1;
      }
      iVar2 = iVar2 + uVar5;
      iVar4 = iVar4 + (-(uVar1 & 1) & uVar1);
      uVar3 = uVar3 + 1;
    } while ((uint)size != uVar3);
    return iVar2 - iVar4;
  }
  return 0;
}

Assistant:

int calculateEvenOddDifference(int array[], int size)
{
    int evenTotal = 0;
    int oddTotal = 0;

    for(int x = 0; x < size; x++)
    {

        // if value is even...
        if((array[x] % 2) == 0)
        {
            evenTotal += array[x];
        }
        else
        {
            oddTotal += array[x];
        }
    }
    //easy way to calculate what is asked for
    return evenTotal - oddTotal;
}